

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

bool __thiscall
kj::anon_unknown_59::InMemoryDirectory::trySymlink
          (InMemoryDirectory *this,PathPtr path,StringPtr content,WriteMode mode)

{
  size_t sVar1;
  undefined8 uVar2;
  undefined1 uVar3;
  Predicate *pPVar4;
  size_t sVar5;
  char *pcVar6;
  String *pSVar7;
  StringPtr value;
  StringPtr name;
  StringPtr name_00;
  Fault f;
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  undefined1 local_68 [16];
  size_t sStack_58;
  ArrayDisposer *local_50;
  undefined1 local_48 [24];
  
  sVar5 = path.parts.size_;
  pSVar7 = path.parts.ptr;
  if (sVar5 == 1) {
    MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockExclusive
              ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_48,
               &this->impl);
    sVar5 = (pSVar7->content).size_;
    if (sVar5 == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pSVar7->content).ptr;
    }
    sVar5 = sVar5 + (sVar5 == 0);
    name.content.size_ = (size_t)pcVar6;
    name.content.ptr = (char *)local_48._8_8_;
    Impl::openEntry((Impl *)local_68,name,(WriteMode)sVar5);
    uVar2 = local_68._0_8_;
    uVar3 = (Exception *)local_68._0_8_ != (Exception *)0x0;
    if ((bool)uVar3) {
      local_68._0_8_ = (*(code *)**(undefined8 **)*(_func_int **)local_48._8_8_)();
      value.content.size_ = sVar5;
      value.content.ptr = (char *)content.content.size_;
      heapString((String *)(local_68 + 8),(kj *)content.content.ptr,value);
      if (*(int *)(uVar2 + 0x18) != 0) {
        OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
        ::destroy((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                   *)(uVar2 + 0x18));
      }
      *(undefined8 *)(uVar2 + 0x20) = local_68._0_8_;
      (((String *)(uVar2 + 0x28))->content).ptr = (char *)local_68._8_8_;
      (((String *)(uVar2 + 0x28))->content).size_ = sStack_58;
      (((String *)(uVar2 + 0x28))->content).disposer = local_50;
      local_68._8_8_ = (InMemoryFileFactory *)0x0;
      sStack_58 = 0;
      *(undefined4 *)(uVar2 + 0x18) = 3;
      Array<char>::~Array((Array<char> *)(local_68 + 8));
      pPVar4 = (Predicate *)(*(code *)**(undefined8 **)*(_func_int **)local_48._8_8_)();
      *(Predicate **)(local_48._8_8_ + 0x40) = pPVar4;
    }
    Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
              ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_48);
  }
  else if (sVar5 == 0) {
    if ((mode & CREATE) == 0) {
      uVar3 = 0;
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                ((Fault *)local_68,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x4de,FAILED,(char *)0x0,"\"can\'t replace self\"",
                 (char (*) [19])"can\'t replace self");
      kj::_::Debug::Fault::~Fault((Fault *)local_68);
    }
    else {
      uVar3 = 0;
    }
  }
  else {
    sVar1 = (pSVar7->content).size_;
    if (sVar1 == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pSVar7->content).ptr;
    }
    name_00.content.size_ = (size_t)pcVar6;
    name_00.content.ptr = (char *)this;
    local_48._16_8_ = (_Base_ptr)content.content.size_;
    tryGetParent((InMemoryDirectory *)local_48,name_00,(int)sVar1 + (uint)(sVar1 == 0));
    uVar2 = local_48._8_8_;
    local_68._0_8_ = local_48._0_8_;
    local_68._8_8_ = local_48._8_8_;
    local_48._8_8_ = (Waiter *)0x0;
    Own<const_kj::Directory,_std::nullptr_t>::dispose
              ((Own<const_kj::Directory,_std::nullptr_t> *)local_48);
    if ((Waiter *)uVar2 == (Waiter *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[33]>
                ((Fault *)local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x4ed,FAILED,(char *)0x0,"\"couldn\'t create parent directory\"",
                 (char (*) [33])"couldn\'t create parent directory");
      kj::_::Debug::Fault::~Fault((Fault *)local_48);
      uVar3 = 0;
    }
    else {
      uVar3 = (**(code **)(*(_func_int **)uVar2 + 0x98))
                        (uVar2,pSVar7 + 1,sVar5 - 1,(kj *)content.content.ptr,local_48._16_8_,mode);
    }
    Own<const_kj::Directory,_std::nullptr_t>::dispose
              ((Own<const_kj::Directory,_std::nullptr_t> *)local_68);
  }
  return (bool)uVar3;
}

Assistant:

bool trySymlink(PathPtr path, StringPtr content, WriteMode mode) const override {
    if (path.size() == 0) {
      if (has(mode, WriteMode::CREATE)) {
        return false;
      } else {
        KJ_FAIL_REQUIRE("can't replace self") { return false; }
      }
    } else if (path.size() == 1) {
      auto lock = impl.lockExclusive();
      KJ_IF_SOME(entry, lock->openEntry(path[0], mode)) {
        entry.init(SymlinkNode { lock->clock.now(), heapString(content) });
        lock->modified();
        return true;
      } else {
        return false;
      }
    } else {
      KJ_IF_SOME(child, tryGetParent(path[0], mode)) {
        return child->trySymlink(path.slice(1, path.size()), content, mode);
      } else {
        KJ_FAIL_REQUIRE("couldn't create parent directory") { return false; }
      }